

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_format_7zip_read_data_skip(archive_read *a)

{
  long lVar1;
  int64_t iVar2;
  size_t in_RDI;
  int64_t bytes_skipped;
  _7zip *zip;
  archive_read *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  lVar1 = **(long **)(in_RDI + 0x948);
  if (*(long *)(lVar1 + 0x120) != 0) {
    read_consume(in_stack_ffffffffffffffe0);
  }
  if (*(char *)(lVar1 + 0xd0) == '\0') {
    iVar2 = skip_stream((archive_read *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    if (iVar2 < 0) {
      iVar3 = -0x1e;
    }
    else {
      *(undefined8 *)(lVar1 + 0xc0) = 0;
      *(undefined1 *)(lVar1 + 0xd0) = 1;
      iVar3 = 0;
    }
  }
  else {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
archive_read_format_7zip_read_data_skip(struct archive_read *a)
{
	struct _7zip *zip;
	int64_t bytes_skipped;

	zip = (struct _7zip *)(a->format->data);

	if (zip->pack_stream_bytes_unconsumed)
		read_consume(a);

	/* If we've already read to end of data, we're done. */
	if (zip->end_of_entry)
		return (ARCHIVE_OK);

	/*
	 * If the length is at the beginning, we can skip the
	 * compressed data much more quickly.
	 */
	bytes_skipped = skip_stream(a, (size_t)zip->entry_bytes_remaining);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);
	zip->entry_bytes_remaining = 0;

	/* This entry is finished and done. */
	zip->end_of_entry = 1;
	return (ARCHIVE_OK);
}